

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

void __thiscall
andres::Marray<int,std::allocator<unsigned_long>>::
Marray<andres::UnaryViewExpression<andres::View<int,true,std::allocator<unsigned_long>>,int,andres::marray_detail::Negate<int>>,int>
          (Marray<int,std::allocator<unsigned_long>> *this,
          ViewExpression<andres::UnaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>,_int>
          *expression,allocator_type *allocator)

{
  CoordinateOrder CVar1;
  View<int,_true,_std::allocator<unsigned_long>_> *pVVar2;
  View<int,_true,_std::allocator<unsigned_long>_> *this_00;
  int *piVar3;
  size_t sVar4;
  size_t *end;
  unsigned_long *puVar5;
  void *__src;
  reference piVar6;
  runtime_error *this_01;
  ulong uVar7;
  allocator_type local_71;
  size_t *local_70;
  int local_68 [2];
  void *local_60;
  long local_48;
  undefined8 local_40;
  undefined4 local_38;
  Marray<int,std::allocator<unsigned_long>> local_34;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined4 *)(this + 0x38) = 1;
  this[0x3c] = (Marray<int,std::allocator<unsigned_long>>)0x1;
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
  piVar3 = __gnu_cxx::new_allocator<int>::allocate
                     ((new_allocator<int> *)(this + 0x40),*(size_type *)(*(long *)expression + 0x30)
                      ,(void *)0x0);
  *(int **)this = piVar3;
  sVar4 = UnaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>
          ::dimension((UnaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>
                       *)expression);
  if (sVar4 == 0) {
    pVVar2 = *(View<int,_true,_std::allocator<unsigned_long>_> **)expression;
    View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(pVVar2);
    __src = operator_new(0);
    CVar1 = (pVVar2->geometry_).coordinateOrder_;
    if (*(long *)(this + 0x28) != 0) {
      operator_delete(*(void **)(this + 0x10),*(long *)(this + 0x28) * 0x18);
      *(undefined8 *)(this + 0x28) = 0;
      puVar5 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                         ((new_allocator<unsigned_long> *)(this + 8),0,(void *)0x0);
      *(unsigned_long **)(this + 0x10) = puVar5;
      *(unsigned_long **)(this + 0x18) = puVar5 + *(long *)(this + 0x28);
      *(unsigned_long **)(this + 0x20) = puVar5 + *(long *)(this + 0x28) + *(long *)(this + 0x28);
      *(undefined8 *)(this + 0x28) = 0;
    }
    memcpy(*(void **)(this + 0x10),__src,*(long *)(this + 0x28) * 0x18);
    *(undefined8 *)(this + 0x30) = 1;
    *(CoordinateOrder *)(this + 0x38) = CVar1;
    this[0x3c] = (Marray<int,std::allocator<unsigned_long>>)0x1;
    uVar7 = 0;
  }
  else {
    local_70 = UnaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>
               ::shapeBegin((UnaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>
                             *)expression);
    end = UnaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>
          ::shapeEnd((UnaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>
                      *)expression);
    pVVar2 = *(View<int,_true,_std::allocator<unsigned_long>_> **)expression;
    View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(pVVar2);
    this_00 = *(View<int,_true,_std::allocator<unsigned_long>_> **)expression;
    View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(this_00);
    marray_detail::Geometry<std::allocator<unsigned_long>>::Geometry<unsigned_long_const*>
              ((Geometry<std::allocator<unsigned_long>> *)local_68,local_70,end,
               &(pVVar2->geometry_).coordinateOrder_,&(this_00->geometry_).coordinateOrder_,
               &local_71);
    if ((Geometry<std::allocator<unsigned_long>> *)local_68 !=
        (Geometry<std::allocator<unsigned_long>> *)(this + 8)) {
      if (local_48 != *(long *)(this + 0x28)) {
        operator_delete(*(void **)(this + 0x10),*(long *)(this + 0x28) * 0x18);
        *(long *)(this + 0x28) = local_48;
        puVar5 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                           ((new_allocator<unsigned_long> *)(this + 8),local_48 * 3,(void *)0x0);
        *(unsigned_long **)(this + 0x10) = puVar5;
        *(unsigned_long **)(this + 0x18) = puVar5 + *(long *)(this + 0x28);
        *(unsigned_long **)(this + 0x20) = puVar5 + *(long *)(this + 0x28) + *(long *)(this + 0x28);
        *(long *)(this + 0x28) = local_48;
      }
      memcpy(*(void **)(this + 0x10),local_60,*(long *)(this + 0x28) * 0x18);
      *(undefined8 *)(this + 0x30) = local_40;
      *(undefined4 *)(this + 0x38) = local_38;
      this[0x3c] = local_34;
    }
    uVar7 = local_48 * 0x18;
    __src = local_60;
  }
  operator_delete(__src,uVar7);
  sVar4 = UnaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>
          ::dimension((UnaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>
                       *)expression);
  uVar7 = ((*(View<int,_true,_std::allocator<unsigned_long>_> **)expression)->geometry_).size_;
  if (sVar4 == 0) {
    if (1 < uVar7) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,"Assertion failed.");
      goto LAB_001fe792;
    }
    local_68[0] = 0;
    piVar6 = marray_detail::AccessOperatorHelper<true>::
             execute<int,int,true,std::allocator<unsigned_long>>
                       (*(View<int,_true,_std::allocator<unsigned_long>_> **)expression,local_68);
    **(int **)this = -*piVar6;
  }
  else {
    if (uVar7 == 0) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,"Assertion failed.");
      goto LAB_001fe792;
    }
    marray_detail::
    operate<andres::marray_detail::Assign<int,int>,int,std::allocator<unsigned_long>,andres::UnaryViewExpression<andres::View<int,true,std::allocator<unsigned_long>>,int,andres::marray_detail::Negate<int>>,int>
              (this,expression);
  }
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
  if (this[0x3c] != (Marray<int,std::allocator<unsigned_long>>)0x0) {
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"Assertion failed.");
LAB_001fe792:
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline
Marray<T, A>::Marray
(
    const ViewExpression<E, Te>& expression,
    const allocator_type& allocator
) 
:   dataAllocator_(allocator)
{
    this->data_ = dataAllocator_.allocate(expression.size());
    if(expression.dimension() == 0) {
        this->geometry_ = geometry_type(0, 
            static_cast<const E&>(expression).coordinateOrder(), 
            1, true, dataAllocator_);
    }
    else {
        this->geometry_ = geometry_type(
            static_cast<const E&>(expression).shapeBegin(), 
            static_cast<const E&>(expression).shapeEnd(),
            static_cast<const E&>(expression).coordinateOrder(),
            static_cast<const E&>(expression).coordinateOrder(),
            dataAllocator_);

    }
    const E& e = static_cast<const E&>(expression);
    if(e.dimension() == 0) {
        marray_detail::Assert(MARRAY_NO_ARG_TEST || e.size() < 2);
        this->data_[0] = static_cast<T>(e(0));
    }
    else {
        marray_detail::Assert(MARRAY_NO_ARG_TEST || e.size() != 0);
        marray_detail::operate(*this, e, marray_detail::Assign<T, Te>());
    }
    testInvariant();
}